

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *poVar1;
  
  if (side - 9U < 0xfffffffb) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapequad.cpp"
               ,0x173);
  }
  if (side - 4U < 4) {
    TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
    return;
  }
  if (side == 8) {
    ShapeInternal(x,order,phi,dphi);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Wrong side parameter");
  std::endl<char,std::char_traits<char>>(poVar1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapequad.cpp"
             ,0x187);
}

Assistant:

void TPZShapeQuad::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        if (side < 4 || side > 8) {
            DebugStop();
        }
        
        switch (side) {

            case 4:
            case 5:
            case 6:
            case 7:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 8:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
            LOGPZ_ERROR(logger,"Wrong side parameter")
                DebugStop();
                break;
        }
      
        
      
    }